

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool InputTextFilterCharacter
               (uint *p_char,ImGuiInputTextFlags flags,ImGuiInputTextCallback callback,
               void *user_data,ImGuiInputSource input_source)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  ImGuiInputTextCallbackData local_48;
  
  if ((input_source != ImGuiInputSource_Keyboard) && (input_source != ImGuiInputSource_Clipboard)) {
    __assert_fail("input_source == ImGuiInputSource_Keyboard || input_source == ImGuiInputSource_Clipboard"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                  ,0xedf,
                  "bool InputTextFilterCharacter(unsigned int *, ImGuiInputTextFlags, ImGuiInputTextCallback, void *, ImGuiInputSource)"
                 );
  }
  uVar4 = *p_char;
  bVar2 = true;
  if ((uVar4 < 0x20) &&
     (bVar5 = ((uint)flags >> 0x1a & 1) == 0, bVar6 = ((uint)flags >> 10 & 1) == 0,
     bVar2 = (bVar6 || uVar4 != 9) && (bVar5 || uVar4 != 10),
     (bVar6 || uVar4 != 9) && (bVar5 || uVar4 != 10))) {
    return false;
  }
  if (input_source == ImGuiInputSource_Clipboard) {
    if (0xffff < uVar4) {
      return false;
    }
  }
  else {
    if (0xffff < uVar4) {
      return false;
    }
    if (uVar4 == 0x7f) {
      return false;
    }
    if (uVar4 - 0xe000 < 0x1900) {
      return false;
    }
  }
  if ((bool)(bVar2 ^ 1U | (flags & 0x2000fU) == 0)) goto LAB_001809d9;
  uVar1 = uVar4 - 0x30;
  if ((uVar1 < 10 || (flags & 1U) == 0) || (uVar4 == (int)GImGui->PlatformLocaleDecimalPoint)) {
LAB_0018091a:
    if ((((((((uint)flags >> 0x11 & 1) == 0 || uVar1 < 10) || ((uVar4 & 0xffdf) == 0x45)) ||
          (uVar4 == 0x2f)) || ((0xfffffffd < uVar4 - 0x2c || (uVar4 == 0x2d)))) ||
        (uVar4 == (int)GImGui->PlatformLocaleDecimalPoint)) &&
       ((uVar4 - 0x41 < 6 || (flags & 2U) == 0) || (uVar4 - 0x61 < 6 || uVar1 < 10))) {
      if ((uVar4 - 0x61 < 0x1a & (byte)flags >> 2) == 1) {
        uVar4 = uVar4 - 0x20;
        *p_char = uVar4;
      }
      bVar2 = true;
      if (((flags & 8U) == 0) || (((uVar4 != 9 && (uVar4 != 0x20)) && (uVar4 != 0x3000))))
      goto LAB_001809d5;
    }
    bVar2 = false;
  }
  else {
    bVar2 = false;
    if ((uVar4 < 0x30) && (bVar2 = false, (0xac0000000000U >> ((ulong)uVar4 & 0x3f) & 1) != 0))
    goto LAB_0018091a;
  }
LAB_001809d5:
  if (!bVar2) {
    return false;
  }
LAB_001809d9:
  if (((uint)flags >> 9 & 1) == 0) {
    return true;
  }
  local_48.Buf = (char *)0x0;
  local_48.BufTextLen = 0;
  local_48.BufSize = 0;
  local_48.BufDirty = false;
  local_48._41_3_ = 0;
  local_48.CursorPos = 0;
  local_48.SelectionStart = 0;
  local_48.SelectionEnd = 0;
  local_48._18_6_ = 0;
  local_48.EventChar = (ushort)uVar4;
  local_48.Flags = flags;
  local_48.EventFlag = 0x200;
  local_48.UserData = user_data;
  iVar3 = (*callback)(&local_48);
  if (iVar3 == 0) {
    *p_char = (uint)local_48.EventChar;
    if (local_48.EventChar != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool InputTextFilterCharacter(unsigned int* p_char, ImGuiInputTextFlags flags, ImGuiInputTextCallback callback, void* user_data, ImGuiInputSource input_source)
{
    IM_ASSERT(input_source == ImGuiInputSource_Keyboard || input_source == ImGuiInputSource_Clipboard);
    unsigned int c = *p_char;

    // Filter non-printable (NB: isprint is unreliable! see #2467)
    bool apply_named_filters = true;
    if (c < 0x20)
    {
        bool pass = false;
        pass |= (c == '\n' && (flags & ImGuiInputTextFlags_Multiline));
        pass |= (c == '\t' && (flags & ImGuiInputTextFlags_AllowTabInput));
        if (!pass)
            return false;
        apply_named_filters = false; // Override named filters below so newline and tabs can still be inserted.
    }

    if (input_source != ImGuiInputSource_Clipboard)
    {
        // We ignore Ascii representation of delete (emitted from Backspace on OSX, see #2578, #2817)
        if (c == 127)
            return false;

        // Filter private Unicode range. GLFW on OSX seems to send private characters for special keys like arrow keys (FIXME)
        if (c >= 0xE000 && c <= 0xF8FF)
            return false;
    }

    // Filter Unicode ranges we are not handling in this build
    if (c > IM_UNICODE_CODEPOINT_MAX)
        return false;

    // Generic named filters
    if (apply_named_filters && (flags & (ImGuiInputTextFlags_CharsDecimal | ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsUppercase | ImGuiInputTextFlags_CharsNoBlank | ImGuiInputTextFlags_CharsScientific)))
    {
        // The libc allows overriding locale, with e.g. 'setlocale(LC_NUMERIC, "de_DE.UTF-8");' which affect the output/input of printf/scanf to use e.g. ',' instead of '.'.
        // The standard mandate that programs starts in the "C" locale where the decimal point is '.'.
        // We don't really intend to provide widespread support for it, but out of empathy for people stuck with using odd API, we support the bare minimum aka overriding the decimal point.
        // Change the default decimal_point with:
        //   ImGui::GetCurrentContext()->PlatformLocaleDecimalPoint = *localeconv()->decimal_point;
        // Users of non-default decimal point (in particular ',') may be affected by word-selection logic (is_word_boundary_from_right/is_word_boundary_from_left) functions.
        ImGuiContext& g = *GImGui;
        const unsigned c_decimal_point = (unsigned int)g.PlatformLocaleDecimalPoint;

        // Allow 0-9 . - + * /
        if (flags & ImGuiInputTextFlags_CharsDecimal)
            if (!(c >= '0' && c <= '9') && (c != c_decimal_point) && (c != '-') && (c != '+') && (c != '*') && (c != '/'))
                return false;

        // Allow 0-9 . - + * / e E
        if (flags & ImGuiInputTextFlags_CharsScientific)
            if (!(c >= '0' && c <= '9') && (c != c_decimal_point) && (c != '-') && (c != '+') && (c != '*') && (c != '/') && (c != 'e') && (c != 'E'))
                return false;

        // Allow 0-9 a-F A-F
        if (flags & ImGuiInputTextFlags_CharsHexadecimal)
            if (!(c >= '0' && c <= '9') && !(c >= 'a' && c <= 'f') && !(c >= 'A' && c <= 'F'))
                return false;

        // Turn a-z into A-Z
        if (flags & ImGuiInputTextFlags_CharsUppercase)
            if (c >= 'a' && c <= 'z')
                *p_char = (c += (unsigned int)('A' - 'a'));

        if (flags & ImGuiInputTextFlags_CharsNoBlank)
            if (ImCharIsBlankW(c))
                return false;
    }

    // Custom callback filter
    if (flags & ImGuiInputTextFlags_CallbackCharFilter)
    {
        ImGuiInputTextCallbackData callback_data;
        memset(&callback_data, 0, sizeof(ImGuiInputTextCallbackData));
        callback_data.EventFlag = ImGuiInputTextFlags_CallbackCharFilter;
        callback_data.EventChar = (ImWchar)c;
        callback_data.Flags = flags;
        callback_data.UserData = user_data;
        if (callback(&callback_data) != 0)
            return false;
        *p_char = callback_data.EventChar;
        if (!callback_data.EventChar)
            return false;
    }

    return true;
}